

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::InputDeclaration::InputDeclaration(InputDeclaration *this,CodeLocation *l)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (l->sourceCode).object;
  local_18.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  IODeclaration::IODeclaration(&this->super_IODeclaration,&local_18);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  (this->super_IODeclaration).super_Object._vptr_Object = (_func_int **)&PTR__IODeclaration_002d0670
  ;
  return;
}

Assistant:

InputDeclaration (CodeLocation l) : IODeclaration (std::move (l)) {}